

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avxvnni.cpp
# Opt level: O0

void ncnn::pack_A_tile_int8_avxvnni(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  int in_stack_00000198;
  int in_stack_0000019c;
  int in_stack_000001a0;
  int in_stack_000001a4;
  Mat *in_stack_000001a8;
  Mat *in_stack_000001b0;
  
  pack_A_tile_int8(in_stack_000001b0,in_stack_000001a8,in_stack_000001a4,in_stack_000001a0,
                   in_stack_0000019c,in_stack_00000198);
  return;
}

Assistant:

void pack_A_tile_int8_avxvnni(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    pack_A_tile_int8(A, AT, i, max_ii, k, max_kk);
}